

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkq.cpp
# Opt level: O1

void __thiscall
pg::ZLKQSolver::attractVertices(ZLKQSolver *this,int pl,int v,bitset *Z,bitset *R,bitset *Y)

{
  uint uVar1;
  Game *pGVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  ulong uVar8;
  uint uVar9;
  char cVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int *piVar15;
  ulong uVar16;
  _label_vertex local_68;
  bitset *local_58;
  ulong local_50;
  bitset *local_48;
  _label_vertex local_40;
  
  pGVar2 = (this->super_Solver).game;
  piVar15 = pGVar2->_inedges;
  iVar6 = pGVar2->_firstins[v];
  uVar9 = piVar15[iVar6];
  if (uVar9 != 0xffffffff) {
    piVar15 = piVar15 + iVar6;
    local_58 = Y;
    local_48 = R;
    do {
      uVar14 = (ulong)(int)uVar9;
      puVar3 = Z->_bits;
      uVar16 = uVar14 >> 6;
      uVar8 = 1L << (uVar14 & 0x3f);
      if ((puVar3[uVar16] >> (uVar14 & 0x3f) & 1) == 0) {
        if ((local_48->_bits[uVar16] & uVar8) != 0) {
          pGVar2 = (this->super_Solver).game;
          puVar4 = (pGVar2->_owner)._bits;
          if ((uint)((puVar4[uVar16] & uVar8) != 0) != pl) {
            uVar1 = pGVar2->_outedges[pGVar2->_firstouts[uVar14]];
            if (uVar1 != 0xffffffff) {
              puVar11 = (uint *)(pGVar2->_outedges + (long)pGVar2->_firstouts[uVar14] + 1);
              bVar5 = false;
              do {
                uVar13 = (ulong)(long)(int)uVar1 >> 6;
                if (((puVar3[uVar13] >> ((ulong)uVar1 & 0x3f) & 1) == 0) &&
                   ((uVar12 = 1L << ((ulong)uVar1 & 0x3f), (local_48->_bits[uVar13] & uVar12) != 0
                    || ((local_58->_bits[uVar13] & uVar12) != 0)))) {
                  bVar5 = true;
                }
                if (bVar5) break;
                uVar1 = *puVar11;
                puVar11 = puVar11 + 1;
              } while (uVar1 != 0xffffffff);
              local_50 = uVar8;
              if (bVar5) goto LAB_0014eb1b;
            }
          }
          puVar3[uVar16] = puVar3[uVar16] | uVar8;
          iVar6 = -1;
          if ((uint)((puVar4[uVar16] & uVar8) != 0) == pl) {
            iVar6 = v;
          }
          this->str[uVar14] = iVar6;
          iVar6 = (this->Q).pointer;
          (this->Q).pointer = iVar6 + 1;
          (this->Q).queue[iVar6] = uVar9;
          if (2 < (this->super_Solver).trace) {
            poVar7 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"\x1b[1;37mattracted \x1b[36m",0x16);
            local_68.g = (this->super_Solver).game;
            local_68.v = uVar9;
            poVar7 = operator<<(poVar7,&local_68);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[m by \x1b[1;36m",0xe);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,pl);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[m",3);
            poVar7 = (this->super_Solver).logger;
            if ((uint)(((((this->super_Solver).game)->_owner)._bits[uVar16] & uVar8) != 0) == pl) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," (via ",6);
              local_68.g = (this->super_Solver).game;
              local_68.v = v;
              poVar7 = operator<<(poVar7,&local_68);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
              cVar10 = (char)poVar7;
              std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + cVar10);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," (forced)",9);
              cVar10 = (char)poVar7;
              std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + cVar10);
            }
            std::ostream::put(cVar10);
            std::ostream::flush();
          }
        }
      }
      else if (((uint)(((((this->super_Solver).game)->_owner)._bits[uVar16] & uVar8) != 0) == pl) &&
              (this->str[uVar14] == -1)) {
        if (2 < (this->super_Solver).trace) {
          poVar7 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"\x1b[1;37msetting strategy of \x1b[36m",0x20);
          local_68.g = (this->super_Solver).game;
          local_68.v = uVar9;
          poVar7 = operator<<(poVar7,&local_68);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[m to \x1b[1;36m",0xe);
          local_40.g = (this->super_Solver).game;
          local_40.v = v;
          poVar7 = operator<<(poVar7,&local_40);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[m",3);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
        this->str[uVar14] = v;
      }
LAB_0014eb1b:
      uVar9 = piVar15[1];
      piVar15 = piVar15 + 1;
    } while (uVar9 != 0xffffffff);
  }
  return;
}

Assistant:

void
ZLKQSolver::attractVertices(const int pl, const int v, bitset &Z, bitset &R, bitset &Y)
{
    auto curedge = ins(v);
    for (int from = *curedge; from != -1; from = *++curedge) {
        if (Z[from]) {
            // already in Z, set strategy if not yet set
            if (owner(from) == pl and str[from] == -1) {
#ifndef NDEBUG
                if (trace >= 3) {
                    logger << "\033[1;37msetting strategy of \033[36m" << label_vertex(from) << "\033[m to \033[1;36m" << label_vertex(v) << "\033[m" << std::endl;
                }
#endif
                str[from] = v;
            }
        } else if (R[from]) {
            // a vertex in <R> that is not yet in <Z>
            if (owner(from) != pl) {
                // check each exit
                bool escapes = false;
                auto curedge = outs(from);
                for (int to = *curedge; !escapes and to != -1; to = *++curedge) {
                    // check if escapes to a vertex in <R> or <Y> that is not in <Z>
                    if (!Z[to] and (R[to] or Y[to])) escapes = true;
                }
                if (escapes) continue;
            }
            // vertex does not escape, so attract it
            Z[from] = true;
            str[from] = owner(from) == pl ? v : -1;
            Q.push(from);
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(from) << "\033[m by \033[1;36m" << pl << "\033[m";
                if (owner(from) == pl) logger << " (via " << label_vertex(v) << ")" << std::endl;
                else logger << " (forced)" << std::endl;
            }
#endif
        }
    }
}